

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O3

bool __thiscall BamTools::Internal::BamToolsIndex::Load(BamToolsIndex *this,string *filename)

{
  OpenFile(this,filename,ReadOnly);
  LoadHeader(this);
  LoadFileSummary(this);
  return true;
}

Assistant:

bool BamToolsIndex::Load(const std::string& filename)
{

    try {

        // attempt to open file (read-only)
        OpenFile(filename, IBamIODevice::ReadOnly);

        // load metadata & generate in-memory summary
        LoadHeader();
        LoadFileSummary();

        // return success
        return true;

    } catch (BamException& e) {
        m_errorString = e.what();
        return false;
    }
}